

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O1

nodeit * __thiscall N::operator[](nodeit *__return_storage_ptr__,N *this,N *p)

{
  pointer ppNVar1;
  uint uVar2;
  ulong uVar3;
  pointer ppNVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer ppNVar8;
  
  if (p == (N *)0x0) {
    ppNVar4 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar8 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    ppNVar4 = (this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar3 = 0;
    lVar7 = (long)(this->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppNVar4;
    if (lVar7 == 0) {
      lVar6 = 0;
    }
    else {
      lVar7 = lVar7 >> 3;
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      lVar5 = 0;
      do {
        uVar2 = (uint)uVar3;
        lVar6 = lVar5;
        if (ppNVar4[lVar5] == p) break;
        uVar2 = uVar2 + (this->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar5];
        uVar3 = (ulong)uVar2;
        lVar5 = lVar5 + 1;
        lVar6 = lVar7;
      } while (lVar7 != lVar5);
      uVar3 = (ulong)(int)uVar2;
    }
    ppNVar1 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar4 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppNVar8 = ppNVar4;
    if ((long)ppNVar4 - (long)ppNVar1 >> 3 != uVar3) {
      ppNVar4 = ppNVar1 + uVar3;
      ppNVar8 = ppNVar4 + (this->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6];
    }
  }
  (__return_storage_ptr__->_start)._M_current = ppNVar4;
  (__return_storage_ptr__->_end)._M_current = ppNVar8;
  (__return_storage_ptr__->_curr)._M_current = ppNVar4;
  __return_storage_ptr__->next =
       (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

nodeit N::operator[](const N* p) {
    if (p == nullptr) return (*this).all();

    int offset = 0, i = 0;
    while (i < ps.size() and ps[i] != p) offset += osi[i++];

    if (offset == os.size()) return nodeit(os.end(), os.end());
    return nodeit(os.begin() + offset, os.begin() + offset + osi[i]);
}